

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FM.cpp
# Opt level: O3

void __thiscall GainBuckets::delCell(GainBuckets *this,int gain,const_iterator iter)

{
  size_t *psVar1;
  Bucket *pBVar2;
  _List_node_base *p_Var3;
  
  this->num_elems_ = this->num_elems_ - 1;
  pBVar2 = operator[][abi_cxx11_(this,gain);
  psVar1 = &(pBVar2->super__List_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl._M_node.
            _M_size;
  *psVar1 = *psVar1 - 1;
  std::__detail::_List_node_base::_M_unhook();
  operator_delete(iter._M_node,0x18);
  if (this->best_gain_ == gain) {
    while (p_Var3 = (_List_node_base *)operator[][abi_cxx11_(this,gain),
          (((_List_base<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var3->_M_next)->_M_impl).
          _M_node.super__List_node_base._M_next == p_Var3) {
      if (this->max_gain_ + this->best_gain_ == 0) {
        this->best_gain_ = -0x80000000;
        return;
      }
      gain = this->best_gain_ + -1;
      this->best_gain_ = gain;
    }
  }
  return;
}

Assistant:

void GainBuckets::delCell(int gain, GainBuckets::Bucket::const_iterator iter) {
  --num_elems_;
  (*this)[gain].erase(iter);
  if (best_gain_ == gain)
    while ((*this)[best_gain_].empty()) {
      if (best_gain_ == -(int)max_gain_) {
        best_gain_ = INT_MIN;
        break;
      }
      --best_gain_;
    }
}